

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSByteGetterSuffix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BytesMode bytes_mode)

{
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  string *psStack_10;
  BytesMode bytes_mode_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"B64",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    if (local_14 != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                    ,0x1fb,
                    "string google::protobuf::compiler::js::(anonymous namespace)::JSByteGetterSuffix(BytesMode)"
                   );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"U8",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return __return_storage_ptr__;
}

Assistant:

string JSByteGetterSuffix(BytesMode bytes_mode) {
  switch (bytes_mode) {
    case BYTES_DEFAULT:
      return "";
    case BYTES_B64:
      return "B64";
    case BYTES_U8:
      return "U8";
    default:
      assert(false);
  }
  return "";
}